

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

string * __thiscall
inja::Environment::render_file
          (string *__return_storage_ptr__,Environment *this,path *filename,json *data)

{
  Template TStack_98;
  
  parse_template(&TStack_98,this,filename);
  render(__return_storage_ptr__,this,&TStack_98,data);
  Template::~Template(&TStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::string render_file(const std::filesystem::path& filename, const json& data) {
    return render(parse_template(filename), data);
  }